

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyrsa.cpp
# Opt level: O2

int VerifyRSA::sign(EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen)

{
  long lVar1;
  RSA *rsa;
  int iVar2;
  size_t encMessageLength;
  char *base64Text;
  uchar *encMessage;
  size_t local_30;
  int local_28 [2];
  uchar *local_20;
  
  lVar1 = std::__cxx11::string::find((char *)ctx,0x103000);
  iVar2 = 0;
  if (lVar1 == 0) {
    if (*(long *)(sig + 8) == 0) {
      iVar2 = 0;
    }
    else {
      rsa = createPrivateRSA((string *)ctx);
      RSASign(rsa,*(uchar **)sig,*(size_t *)(sig + 8),&local_20,&local_30);
      Base64Encode(local_20,local_30,(char **)local_28);
      free(local_20);
      iVar2 = local_28[0];
    }
  }
  return iVar2;
}

Assistant:

char *VerifyRSA::sign(std::string privateKey, std::string plainText)
{
    if (privateKey.find("-----BEGIN RSA PRIVATE KEY-----",0)!=0 ||
        plainText.empty())
    {
        return NULL;
    }
    RSA* privateRSA = createPrivateRSA(privateKey);
    unsigned char* encMessage;
    char* base64Text;
    size_t encMessageLength;
    RSASign(privateRSA, (unsigned char*)plainText.c_str(), plainText.length(), &encMessage, &encMessageLength);
    Base64Encode(encMessage, encMessageLength, &base64Text);
    free(encMessage);
    return base64Text;
}